

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydengine.cpp
# Opt level: O0

void __thiscall HydEngine::HydEngine(HydEngine *this)

{
  HydEngine *this_local;
  
  this->engineState = CLOSED;
  this->network = (Network *)0x0;
  this->hydSolver = (HydSolver *)0x0;
  this->matrixSolver = (MatrixSolver *)0x0;
  this->saveToFile = false;
  this->halted = false;
  this->startTime = 0;
  this->rptTime = 0;
  this->hydStep = 0;
  this->currentTime = 0;
  this->timeOfDay = 0;
  this->peakKwatts = 0.0;
  std::__cxx11::string::string((string *)&this->timeStepReason);
  return;
}

Assistant:

HydEngine::HydEngine() :
    engineState(HydEngine::CLOSED),
    network(nullptr),
    hydSolver(nullptr),
    matrixSolver(nullptr),
    saveToFile(false),
    halted(false),
    startTime(0),
    rptTime(0),
    hydStep(0),
    currentTime(0),
    timeOfDay(0),
    peakKwatts(0.0)
{
}